

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.hpp
# Opt level: O2

void Diligent::LogError<true,std::__cxx11::string>
               (bool IsFatal,char *Function,char *FullFilePath,int Line,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_00;
  char *pcVar2;
  undefined1 auVar3 [16];
  string Msg;
  string FileName;
  
  std::__cxx11::string::string((string *)&FileName,FullFilePath,(allocator *)&Msg);
  auVar3 = std::__cxx11::string::find_last_of((char *)&FileName,0x6d0137);
  Args_00 = auVar3._8_8_;
  if (auVar3._0_8_ != -1) {
    std::__cxx11::string::erase((ulong)&FileName,0);
    Args_00 = extraout_RDX;
  }
  FormatString<std::__cxx11::string>(&Msg,(Diligent *)Args,Args_00);
  if (DebugMessageCallback == (undefined *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Diligent Engine: ");
    pcVar2 = "Error";
    if (IsFatal) {
      pcVar2 = "Fatal Error";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1," in ");
    poVar1 = std::operator<<(poVar1,Function);
    poVar1 = std::operator<<(poVar1,"() (");
    poVar1 = std::operator<<(poVar1,(string *)&FileName);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,Line);
    poVar1 = std::operator<<(poVar1,"): ");
    poVar1 = std::operator<<(poVar1,(string *)&Msg);
    std::operator<<(poVar1,'\n');
  }
  else {
    (*(code *)DebugMessageCallback)
              (IsFatal | 2,Msg._M_dataplus._M_p,Function,FileName._M_dataplus._M_p,Line);
  }
  ThrowIf<true>(&Msg);
  std::__cxx11::string::~string((string *)&Msg);
  std::__cxx11::string::~string((string *)&FileName);
  return;
}

Assistant:

void LogError(bool IsFatal, const char* Function, const char* FullFilePath, int Line, const ArgsType&... Args)
{
    std::string FileName(FullFilePath);

    auto LastSlashPos = FileName.find_last_of("/\\");
    if (LastSlashPos != std::string::npos)
        FileName.erase(0, LastSlashPos + 1);
    auto Msg = FormatString(Args...);
    if (DebugMessageCallback != nullptr)
    {
        DebugMessageCallback(IsFatal ? DEBUG_MESSAGE_SEVERITY_FATAL_ERROR : DEBUG_MESSAGE_SEVERITY_ERROR, Msg.c_str(), Function, FileName.c_str(), Line);
    }
    else
    {
        // No callback set - output to cerr
        std::cerr << "Diligent Engine: " << (IsFatal ? "Fatal Error" : "Error") << " in " << Function << "() (" << FileName << ", " << Line << "): " << Msg << '\n';
    }
    ThrowIf<bThrowException>(std::move(Msg));
}